

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O2

void * my_canvas_new(t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags tVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  t_iemgui *iemgui;
  _glist *p_Var6;
  ulong uVar7;
  t_symbol *ptVar8;
  uint uVar9;
  int iVar10;
  t_float tVar11;
  t_float tVar12;
  undefined1 auVar13 [16];
  uint local_a8;
  uint uStack_a4;
  undefined8 local_98;
  char str [80];
  
  iemgui = iemgui_new(my_canvas_class);
  p_Var6 = canvas_getcurrent();
  iVar10 = 1;
  iVar2 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  iVar2 = iVar2 + 5;
  p_Var6 = canvas_getcurrent();
  iVar3 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  p_Var6 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  auVar13._0_8_ = (double)(iVar3 * 100 + 500);
  auVar13._8_8_ = (double)(iVar4 * 0x3c + 300);
  auVar13 = divpd(auVar13,_DAT_001a7dc0);
  local_a8 = (uint)auVar13._0_8_;
  uStack_a4 = (uint)auVar13._8_8_;
  iVar3 = iemgui->x_fontsize;
  str._0_8_ = my_canvas_draw_new;
  str._8_8_ = my_canvas_draw_config;
  str._16_8_ = my_canvas_draw_io;
  str[0x18] = '\0';
  str[0x19] = '\0';
  str[0x1a] = '\0';
  str[0x1b] = '\0';
  str[0x1c] = '\0';
  str[0x1d] = '\0';
  str[0x1e] = '\0';
  str[0x1f] = '\0';
  str._32_8_ = my_canvas_draw_select;
  str[0x28] = '\0';
  str[0x29] = '\0';
  str[0x2a] = '\0';
  str[0x2b] = '\0';
  str[0x2c] = '\0';
  str[0x2d] = '\0';
  str[0x2e] = '\0';
  str[0x2f] = '\0';
  str[0x30] = '\0';
  str[0x31] = '\0';
  str[0x32] = '\0';
  str[0x33] = '\0';
  str[0x34] = '\0';
  str[0x35] = '\0';
  str[0x36] = '\0';
  str[0x37] = '\0';
  iemgui_setdrawfunctions(iemgui,(t_iemgui_drawfunctions *)str);
  iemgui->x_fcol = 0;
  iemgui->x_bcol = 0xe0e0e0;
  iemgui->x_lcol = 0x404040;
  if ((((argc - 10U < 4) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
     (argv[2].a_type == A_FLOAT)) {
    tVar11 = atom_getfloatarg(0,argc,argv);
    iVar2 = (int)tVar11;
    tVar11 = atom_getfloatarg(1,argc,argv);
    tVar12 = atom_getfloatarg(2,argc,argv);
    local_a8 = (uint)tVar11;
    uStack_a4 = (uint)tVar12;
  }
  if (argc < 0xc) {
    if ((argc != 0xb) || (1 < argv[3].a_type - A_FLOAT)) goto LAB_00146e74;
    iemgui_new_getnames(iemgui,3,argv);
LAB_00146e8a:
    uVar7 = (ulong)(uint)(iVar10 << 4);
    iVar4 = *(int *)((long)&argv[3].a_type + uVar7);
    local_98 = 0xc00000014;
    if ((((iVar4 - 1U < 2) && (*(int *)((long)&argv[4].a_type + uVar7) == 1)) &&
        (*(int *)((long)&argv[5].a_type + uVar7) == 1)) &&
       ((*(int *)((long)&argv[6].a_type + uVar7) == 1 &&
        (*(int *)((long)&argv[7].a_type + uVar7) == 1)))) {
      if (iVar4 == 1) {
        atom_string((t_atom *)((long)&argv[3].a_type + uVar7),str,0x50);
        ptVar8 = gensym(str);
      }
      else {
        ptVar8 = iemgui_new_dogetname(iemgui,iVar10 + 3,argv);
      }
      iemgui->x_lab = ptVar8;
      iemgui->x_labelbindex = iVar10 + 4;
      tVar11 = atom_getfloatarg(iVar10 + 4,argc,argv);
      tVar12 = atom_getfloatarg(iVar10 + 5,argc,argv);
      local_98 = CONCAT44((int)tVar12,(int)tVar11);
      tVar11 = atom_getfloatarg(iVar10 + 6,argc,argv);
      iem_inttofstyle(&iemgui->x_fsf,(int)tVar11);
      tVar11 = atom_getfloatarg(iVar10 + 7,argc,argv);
      iVar3 = (int)tVar11;
      iemgui->x_fontsize = iVar3;
      iemgui_all_loadcolors
                (iemgui,(t_atom *)((long)&argv[8].a_type + uVar7),(t_atom *)0x0,
                 (t_atom *)((long)&argv[9].a_type + uVar7));
    }
    if ((argc == 0xd) && (*(int *)((long)&argv[10].a_type + uVar7) == 1)) {
      tVar11 = atom_getfloatarg(iVar10 + 10,0xd,argv);
      iem_inttosymargs(&iemgui->x_isa,(int)tVar11);
    }
  }
  else {
    if ((argv[3].a_type - A_FLOAT < 2) && (argv[4].a_type - A_FLOAT < 2)) {
      iemgui_new_getnames(iemgui,3,argv);
      iVar10 = 2;
    }
    else {
LAB_00146e74:
      iVar10 = 0;
      iemgui_new_getnames(iemgui,3,(t_atom *)0x0);
    }
    if (argc - 10U < 4) goto LAB_00146e8a;
    local_98 = 0xc00000014;
  }
  tVar1 = iemgui->x_fsf;
  uVar5 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  ptVar8 = iemgui->x_rcv;
  uVar9 = (uint)(ptVar8 != (t_symbol *)0x0) << 6;
  if (iVar2 < 2) {
    iVar2 = 1;
  }
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar1 & 0xffffff3f | uVar5);
  iemgui->x_w = iVar2;
  iemgui->x_h = iVar2;
  *(uint *)&iemgui[1].x_glist =
       ~-(uint)(1 < (int)local_a8) & 1 | local_a8 & -(uint)(1 < (int)local_a8);
  *(uint *)((long)&iemgui[1].x_glist + 4) =
       ~-(uint)(1 < (int)uStack_a4) & 1 | uStack_a4 & -(uint)(1 < (int)uStack_a4);
  if (((uint)tVar1 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
LAB_001470a2:
    if (ptVar8 == (t_symbol *)0x0) goto LAB_001470b6;
  }
  else {
    if (((uint)tVar1 & 0x3f) == 2) {
      builtin_strncpy(iemgui->x_font,"times",6);
      goto LAB_001470a2;
    }
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar1 & 0xffffff00 | uVar5);
    strcpy(iemgui->x_font,sys_font);
    if (((uint)iemgui->x_fsf & 0x40) == 0) goto LAB_001470b6;
  }
  pd_bind((t_pd *)iemgui,iemgui->x_rcv);
LAB_001470b6:
  iVar10 = 4;
  if (4 < iVar3) {
    iVar10 = iVar3;
  }
  iemgui->x_ldx = (undefined4)local_98;
  iemgui->x_ldy = local_98._4_4_;
  iemgui->x_fontsize = iVar10;
  *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 1;
  *(undefined4 *)&iemgui[1].x_obj.te_binbuf = 1;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  return iemgui;
}

Assistant:

static void *my_canvas_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_canvas *x = (t_my_canvas *)iemgui_new(my_canvas_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int w = 100 * IEM_GUI_DEFAULTSIZE_SCALE, h = 60 * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = 20, ldy = 12, f = 2, i = 0;
    int fs = x->x_gui.x_fontsize;

    IEMGUI_SETDRAWFUNCTIONS(x, my_canvas);

    x->x_gui.x_bcol = 0xE0E0E0;
    x->x_gui.x_fcol = 0x00;
    x->x_gui.x_lcol = 0x404040;

    if(((argc >= 10)&&(argc <= 13))
       &&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2))
    {
        a = atom_getfloatarg(0, argc, argv);
        w = atom_getfloatarg(1, argc, argv);
        h = atom_getfloatarg(2, argc, argv);
    }
    if((argc >= 12)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))&&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4)))
    {
        i = 2;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else if((argc == 11)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3)))
    {
        i = 1;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 3, 0);

    if(((argc >= 10)&&(argc <= 13))
       &&(IS_A_SYMBOL(argv,i+3)||IS_A_FLOAT(argv,i+3))&&IS_A_FLOAT(argv,i+4)
       &&IS_A_FLOAT(argv,i+5)&&IS_A_FLOAT(argv,i+6)
       &&IS_A_FLOAT(argv,i+7))
    {
            /* disastrously, the "label" sits in a different part of the
            message.  So we have to track its location separately (in
            the slot x_labelbindex) and initialize it specially here. */
        if(IS_A_FLOAT(argv, i+3))
        {
            char str[80];
            atom_string(argv+i+3, str, sizeof(str));
            x->x_gui.x_lab = gensym(str);
        } else {
            x->x_gui.x_lab = iemgui_new_dogetname(&x->x_gui, i+3, argv);
        }
        x->x_gui.x_labelbindex = i+4;
        ldx = atom_getfloatarg(i+4, argc, argv);
        ldy = atom_getfloatarg(i+5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(i+6, argc, argv));
        fs = atom_getfloatarg(i+7, argc, argv);
        x->x_gui.x_fontsize = fs;
        iemgui_all_loadcolors(&x->x_gui, argv+i+8, 0, argv+i+9);
    }
    if((argc == 13)&&IS_A_FLOAT(argv,i+10))
    {
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(i+10, argc, argv));
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a;
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_at[0].a_type = A_FLOAT;
    x->x_at[1].a_type = A_FLOAT;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    return (x);
}